

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_eltwise.cpp
# Opt level: O0

int test_eltwise_0(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> a;
  Mat *in_stack_00000720;
  int in_stack_0000072c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_00000730;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffd90;
  uint uVar7;
  int in_stack_fffffffffffffd94;
  undefined1 *__n;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  byte bVar8;
  Mat local_180;
  byte local_139;
  Mat local_138;
  Mat local_f8 [3];
  undefined1 local_21;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_20;
  uint local_4;
  
  __n = &local_21;
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x116579);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
             CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),(size_type)__n,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x11659f);
  RandomMat((int)((ulong)__n >> 0x20),(int)__n,in_stack_fffffffffffffd94);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_20,0);
  ncnn::Mat::operator=
            ((Mat *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             (Mat *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  ncnn::Mat::~Mat((Mat *)0x1165ed);
  RandomMat((int)((ulong)__n >> 0x20),(int)__n,in_stack_fffffffffffffd94);
  iVar6 = (int)((ulong)__n >> 0x20);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_20,1);
  ncnn::Mat::operator=
            ((Mat *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             (Mat *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  ncnn::Mat::~Mat((Mat *)0x11663c);
  local_139 = 0;
  bVar3 = false;
  bVar2 = false;
  bVar1 = false;
  bVar8 = 0;
  ncnn::Mat::Mat(local_f8);
  iVar4 = test_eltwise(in_stack_00000730,in_stack_0000072c,in_stack_00000720);
  uVar7 = CONCAT13(1,(int3)in_stack_fffffffffffffd90);
  if (iVar4 == 0) {
    ncnn::Mat::Mat(&local_138);
    local_139 = 1;
    iVar5 = test_eltwise(in_stack_00000730,in_stack_0000072c,in_stack_00000720);
    uVar7 = CONCAT13(1,(int3)uVar7);
    if (iVar5 == 0) {
      ncnn::Mat::Mat(&local_180);
      bVar3 = true;
      iVar5 = test_eltwise(in_stack_00000730,in_stack_0000072c,in_stack_00000720);
      uVar7 = CONCAT13(1,(int3)uVar7);
      if (iVar5 == 0) {
        RandomMat(iVar6);
        bVar2 = true;
        iVar5 = test_eltwise(in_stack_00000730,in_stack_0000072c,in_stack_00000720);
        uVar7 = CONCAT13(1,(int3)uVar7);
        if (iVar5 == 0) {
          RandomMat(iVar6);
          bVar1 = true;
          iVar5 = test_eltwise(in_stack_00000730,in_stack_0000072c,in_stack_00000720);
          uVar7 = CONCAT13(1,(int3)uVar7);
          if (iVar5 == 0) {
            RandomMat(iVar6);
            bVar8 = 1;
            iVar6 = test_eltwise(in_stack_00000730,in_stack_0000072c,in_stack_00000720);
            uVar7 = CONCAT13(iVar6 != 0,(int3)uVar7);
          }
        }
      }
    }
  }
  local_4 = uVar7 >> 0x18;
  if ((bVar8 & 1) != 0) {
    ncnn::Mat::~Mat((Mat *)0x116823);
  }
  if (bVar1) {
    ncnn::Mat::~Mat((Mat *)0x116836);
  }
  if (bVar2) {
    ncnn::Mat::~Mat((Mat *)0x11684f);
  }
  if (bVar3) {
    ncnn::Mat::~Mat((Mat *)0x116868);
  }
  if ((local_139 & 1) != 0) {
    ncnn::Mat::~Mat((Mat *)0x116881);
  }
  ncnn::Mat::~Mat((Mat *)0x11688e);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)CONCAT44(iVar4,uVar7));
  return local_4;
}

Assistant:

static int test_eltwise_0()
{
    std::vector<ncnn::Mat> a(2);
    a[0] = RandomMat(16, 12, 8);
    a[1] = RandomMat(16, 12, 8);

    return 0
        || test_eltwise(a, 0, ncnn::Mat())
        || test_eltwise(a, 1, ncnn::Mat())
        || test_eltwise(a, 2, ncnn::Mat())

        || test_eltwise(a, 0, RandomMat(2))
        || test_eltwise(a, 1, RandomMat(2))
        || test_eltwise(a, 2, RandomMat(2))
        ;
}